

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void p_glow2(obj *otmp,char *color)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar1 = xname(otmp);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023025f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023025a;
    pcVar3 = "glow";
  }
  else {
LAB_0023025a:
    if (ublindf == (obj *)0x0) {
      pcVar3 = "vibrate";
    }
    else {
LAB_0023025f:
      pcVar3 = "vibrate";
      if (ublindf->oartifact == '\x1d') {
        pcVar3 = "glow";
      }
    }
  }
  pcVar3 = otense(otmp,pcVar3);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002302c5;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002302c0;
    pcVar4 = " ";
LAB_0023030f:
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00230332;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023032d;
LAB_00230338:
    pcVar2 = hcolor(color);
  }
  else {
LAB_002302c0:
    if (ublindf == (obj *)0x0) {
      pcVar4 = "";
    }
    else {
LAB_002302c5:
      pcVar4 = "";
      if (ublindf->oartifact == '\x1d') {
        pcVar4 = " ";
      }
    }
    if (u.uprops[0x1e].intrinsic == 0) goto LAB_0023030f;
LAB_0023032d:
    if (ublindf != (obj *)0x0) {
LAB_00230332:
      if (ublindf->oartifact == '\x1d') goto LAB_00230338;
    }
    pcVar2 = "";
  }
  pline("Your %s %s%s%s for a moment.",pcVar1,pcVar3,pcVar4,pcVar2);
  return;
}

Assistant:

static void p_glow2(struct obj *otmp, const char *color)
{
	pline("Your %s %s%s%s for a moment.",
		xname(otmp),
		otense(otmp, Blind ? "vibrate" : "glow"),
		Blind ? "" : " ",
		Blind ? nul : hcolor(color));
}